

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_28bf56::PulseCapture::open(PulseCapture *this,char *__file,int __oflag,...)

{
  PulseMainloop *this_00;
  ALuint AVar1;
  ALCdevice *pAVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  int extraout_EAX;
  pa_context *ppVar6;
  pa_stream *ppVar7;
  pa_operation *op;
  backend_exception *pbVar8;
  ALCchar *pAVar9;
  pa_sample_format_t pVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  int __oflag_00;
  undefined1 *__src;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  char *local_d0;
  unique_lock<std::mutex> plock;
  pa_channel_map chanmap;
  
  if (__file == (char *)0x0) {
    local_d0 = (char *)0x0;
  }
  else {
    if ((anonymous_namespace)::CaptureDevices == DAT_0022e5c0) {
      PulseMainloop::probeCaptureDevices(&this->mMainloop);
    }
    pcVar3 = DAT_0022e5c0;
    lVar15 = (long)DAT_0022e5c0 - (long)(anonymous_namespace)::CaptureDevices;
    pcVar16 = (anonymous_namespace)::CaptureDevices;
    if (0 < lVar15 >> 8) {
      lVar12 = (lVar15 >> 8) + 1;
      do {
        iVar4 = std::__cxx11::string::compare(pcVar16);
        pcVar17 = pcVar16;
        if (iVar4 == 0) goto LAB_00169e15;
        iVar4 = std::__cxx11::string::compare(pcVar16 + 0x40);
        pcVar17 = pcVar16 + 0x40;
        if (iVar4 == 0) goto LAB_00169e15;
        iVar4 = std::__cxx11::string::compare(pcVar16 + 0x80);
        pcVar17 = pcVar16 + 0x80;
        if (iVar4 == 0) goto LAB_00169e15;
        iVar4 = std::__cxx11::string::compare(pcVar16 + 0xc0);
        pcVar17 = pcVar16 + 0xc0;
        if (iVar4 == 0) goto LAB_00169e15;
        pcVar16 = pcVar16 + 0x100;
        lVar12 = lVar12 + -1;
        lVar15 = lVar15 + -0x100;
      } while (1 < lVar12);
    }
    lVar15 = lVar15 >> 6;
    if (lVar15 == 1) {
LAB_00169de8:
      iVar4 = std::__cxx11::string::compare(pcVar16);
      pcVar17 = pcVar3;
      if (iVar4 == 0) {
        pcVar17 = pcVar16;
      }
    }
    else {
      pcVar17 = pcVar16;
      if (lVar15 == 2) {
LAB_00169dd5:
        iVar4 = std::__cxx11::string::compare(pcVar17);
        if (iVar4 != 0) {
          pcVar16 = pcVar17 + 0x40;
          goto LAB_00169de8;
        }
      }
      else {
        pcVar17 = pcVar3;
        if ((lVar15 == 3) &&
           (iVar4 = std::__cxx11::string::compare(pcVar16), pcVar17 = pcVar16, iVar4 != 0)) {
          pcVar17 = pcVar16 + 0x40;
          goto LAB_00169dd5;
        }
      }
    }
LAB_00169e15:
    if (pcVar17 == DAT_0022e5c0) {
      pbVar8 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(pbVar8,0xa004,"Device name \"%s\" not found",__file);
      __cxa_throw(pbVar8,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
    }
    local_d0 = *(char **)(pcVar17 + 0x20);
    std::__cxx11::string::_M_assign((string *)&((this->super_BackendBase).mDevice)->DeviceName);
  }
  this_00 = &this->mMainloop;
  plock._M_device = &(this->mMainloop).mMutex;
  plock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&plock);
  plock._M_owns = true;
  ppVar6 = PulseMainloop::connectContext(this_00,&plock);
  this->mContext = ppVar6;
  memset(&chanmap,0,0x84);
  pAVar2 = (this->super_BackendBase).mDevice;
  switch(pAVar2->FmtChans) {
  case DevFmtMono:
    __src = (anonymous_namespace)::MonoChanMap;
    break;
  case DevFmtChannelsDefault:
    __src = (anonymous_namespace)::StereoChanMap;
    break;
  case DevFmtQuad:
    __src = (anonymous_namespace)::QuadChanMap;
    break;
  case DevFmtX51:
    __src = (anonymous_namespace)::X51ChanMap;
    break;
  case DevFmtX61:
    __src = (anonymous_namespace)::X61ChanMap;
    break;
  case DevFmtX71:
    __src = (anonymous_namespace)::X71ChanMap;
    break;
  case DevFmtAmbi3D:
    pbVar8 = (backend_exception *)__cxa_allocate_exception(0x30);
    pAVar9 = DevFmtChannelsString(((this->super_BackendBase).mDevice)->FmtChans);
    al::backend_exception::backend_exception(pbVar8,0xa004,"%s capture not supported",pAVar9);
    goto LAB_0016a1a1;
  case DevFmtX51Rear:
    __src = (anonymous_namespace)::X51RearChanMap;
    break;
  default:
    goto switchD_00169e9e_default;
  }
  memcpy(&chanmap,__src,0x84);
switchD_00169e9e_default:
  SetChannelOrderFromMap(pAVar2,&chanmap);
  pAVar2 = (this->super_BackendBase).mDevice;
  switch(pAVar2->FmtType) {
  case DevFmtByte:
  case DevFmtUShort:
  case DevFmtUInt:
    pbVar8 = (backend_exception *)__cxa_allocate_exception(0x30);
    pAVar9 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
    al::backend_exception::backend_exception
              (pbVar8,0xa004,"%s capture samples not supported",pAVar9);
    goto LAB_0016a1a1;
  case DevFmtUByte:
    this->mSilentVal = 0x80;
    pVar10 = PA_SAMPLE_U8;
    break;
  case DevFmtShort:
    pVar10 = PA_SAMPLE_S16LE;
    break;
  case DevFmtInt:
    pVar10 = PA_SAMPLE_S32LE;
    break;
  case DevFmtFloat:
    pVar10 = PA_SAMPLE_FLOAT32LE;
    break;
  default:
    goto switchD_00169f18_default;
  }
  (this->mSpec).format = pVar10;
switchD_00169f18_default:
  (this->mSpec).rate = pAVar2->Frequency;
  uVar5 = ChannelsFromDevFmt(pAVar2->FmtChans,pAVar2->mAmbiOrder);
  (this->mSpec).channels = (uint8_t)uVar5;
  iVar4 = (*(anonymous_namespace)::ppa_sample_spec_valid)(&this->mSpec);
  if (iVar4 != 0) {
    iVar4 = (*(anonymous_namespace)::ppa_frame_size)();
    pAVar2 = (this->super_BackendBase).mDevice;
    AVar1 = pAVar2->Frequency;
    uVar11 = pAVar2->BufferSize;
    uVar13 = AVar1 * 100;
    uVar14 = uVar13 / 1000;
    if (uVar13 / 1000 < uVar11) {
      uVar14 = uVar11;
    }
    (this->mAttr).minreq = 0xffffffff;
    (this->mAttr).maxlength = uVar14 * iVar4;
    (this->mAttr).tlength = 0xffffffff;
    (this->mAttr).prebuf = 0xffffffff;
    uVar11 = (AVar1 * 0x32) / 1000;
    if (uVar11 <= uVar14) {
      uVar14 = uVar11;
    }
    (this->mAttr).fragsize = uVar14 * iVar4;
    __oflag_00 = 0x1756da;
    iVar4 = GetConfigValueBool((char *)0x0,"pulse","allow-moves",1);
    if (2 < (int)gLogLevel) {
      _GLOBAL__N_1::PulseCapture::open(local_d0,__oflag_00);
    }
    ppVar7 = PulseMainloop::connectStream
                       (this_00,local_d0,&plock,this->mContext,
                        (uint)(iVar4 == 0) << 9 | (PA_STREAM_ADJUST_LATENCY|PA_STREAM_START_CORKED),
                        &this->mAttr,&this->mSpec,&chanmap,Capture);
    this->mStream = ppVar7;
    (*(anonymous_namespace)::ppa_stream_set_moved_callback)(ppVar7,streamMovedCallbackC,this);
    (*(anonymous_namespace)::ppa_stream_set_state_callback)(this->mStream,streamStateCallbackC,this)
    ;
    pcVar16 = (char *)(*(anonymous_namespace)::ppa_stream_get_device_name)(this->mStream);
    pcVar3 = (char *)(this->mDeviceName)._M_string_length;
    strlen(pcVar16);
    std::__cxx11::string::_M_replace((ulong)&this->mDeviceName,0,pcVar3,(ulong)pcVar16);
    if ((((this->super_BackendBase).mDevice)->DeviceName)._M_string_length == 0) {
      op = (pa_operation *)
           (*(anonymous_namespace)::ppa_context_get_source_info_by_name)
                     (this->mContext,(this->mDeviceName)._M_dataplus._M_p,sourceNameCallbackC,this);
      PulseMainloop::waitForOperation(this_00,op,&plock);
    }
    std::unique_lock<std::mutex>::~unique_lock(&plock);
    return extraout_EAX;
  }
  pbVar8 = (backend_exception *)__cxa_allocate_exception(0x30);
  al::backend_exception::backend_exception(pbVar8,0xa004,"Invalid sample format");
LAB_0016a1a1:
  __cxa_throw(pbVar8,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void PulseCapture::open(const ALCchar *name)
{
    const char *pulse_name{nullptr};
    if(name)
    {
        if(CaptureDevices.empty())
            mMainloop.probeCaptureDevices();

        auto iter = std::find_if(CaptureDevices.cbegin(), CaptureDevices.cend(),
            [name](const DevMap &entry) -> bool { return entry.name == name; });
        if(iter == CaptureDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        pulse_name = iter->device_name.c_str();
        mDevice->DeviceName = iter->name;
    }

    auto plock = mMainloop.getUniqueLock();
    mContext = mMainloop.connectContext(plock);

    pa_channel_map chanmap{};
    switch(mDevice->FmtChans)
    {
    case DevFmtMono:
        chanmap = MonoChanMap;
        break;
    case DevFmtStereo:
        chanmap = StereoChanMap;
        break;
    case DevFmtQuad:
        chanmap = QuadChanMap;
        break;
    case DevFmtX51:
        chanmap = X51ChanMap;
        break;
    case DevFmtX51Rear:
        chanmap = X51RearChanMap;
        break;
    case DevFmtX61:
        chanmap = X61ChanMap;
        break;
    case DevFmtX71:
        chanmap = X71ChanMap;
        break;
    case DevFmtAmbi3D:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture not supported",
            DevFmtChannelsString(mDevice->FmtChans)};
    }
    SetChannelOrderFromMap(mDevice, chanmap);

    switch(mDevice->FmtType)
    {
    case DevFmtUByte:
        mSilentVal = al::byte(0x80);
        mSpec.format = PA_SAMPLE_U8;
        break;
    case DevFmtShort:
        mSpec.format = PA_SAMPLE_S16NE;
        break;
    case DevFmtInt:
        mSpec.format = PA_SAMPLE_S32NE;
        break;
    case DevFmtFloat:
        mSpec.format = PA_SAMPLE_FLOAT32NE;
        break;
    case DevFmtByte:
    case DevFmtUShort:
    case DevFmtUInt:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture samples not supported",
            DevFmtTypeString(mDevice->FmtType)};
    }
    mSpec.rate = mDevice->Frequency;
    mSpec.channels = static_cast<uint8_t>(mDevice->channelsFromFmt());
    if(pa_sample_spec_valid(&mSpec) == 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Invalid sample format"};

    const ALuint frame_size{static_cast<ALuint>(pa_frame_size(&mSpec))};
    const ALuint samples{maxu(mDevice->BufferSize, 100 * mDevice->Frequency / 1000)};
    mAttr.minreq = ~0u;
    mAttr.prebuf = ~0u;
    mAttr.maxlength = samples * frame_size;
    mAttr.tlength = ~0u;
    mAttr.fragsize = minu(samples, 50*mDevice->Frequency/1000) * frame_size;

    pa_stream_flags_t flags{PA_STREAM_START_CORKED | PA_STREAM_ADJUST_LATENCY};
    if(!GetConfigValueBool(nullptr, "pulse", "allow-moves", 1))
        flags |= PA_STREAM_DONT_MOVE;

    TRACE("Connecting to \"%s\"\n", pulse_name ? pulse_name : "(default)");
    mStream = mMainloop.connectStream(pulse_name, plock, mContext, flags, &mAttr, &mSpec, &chanmap,
        BackendType::Capture);

    pa_stream_set_moved_callback(mStream, &PulseCapture::streamMovedCallbackC, this);
    pa_stream_set_state_callback(mStream, &PulseCapture::streamStateCallbackC, this);

    mDeviceName = pa_stream_get_device_name(mStream);
    if(mDevice->DeviceName.empty())
    {
        pa_operation *op{pa_context_get_source_info_by_name(mContext, mDeviceName.c_str(),
            &PulseCapture::sourceNameCallbackC, this)};
        mMainloop.waitForOperation(op, plock);
    }
}